

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O1

bool __thiscall duckdb::Node::GetNextByte(Node *this,ART *art,uint8_t *byte)

{
  _Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false> _Var1;
  idx_t iVar2;
  NType NVar3;
  type paVar4;
  long *plVar5;
  pointer pFVar6;
  data_ptr_t pdVar7;
  ulong uVar8;
  InternalException *this_00;
  __hash_code __code;
  byte bVar9;
  long *plVar10;
  ulong uVar11;
  NType value;
  ulong uVar12;
  uint uVar13;
  long lVar14;
  bool bVar15;
  string local_60;
  string local_40;
  
  uVar11 = (this->super_IndexPointer).data;
  NVar3 = (NType)(uVar11 >> 0x38);
  value = NVar3 & 0x7f;
  uVar13 = (uint)(uVar11 >> 0x20);
  if (value == NODE_256_LEAF) {
    paVar4 = shared_ptr<std::array<duckdb::unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_false>,_9UL>,_true>
             ::operator*(&art->allocators);
    _Var1._M_head_impl =
         paVar4->_M_elems[8].
         super_unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
         ._M_t.
         super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
         .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>._M_head_impl;
    plVar5 = *(long **)(*(long *)&((_Var1._M_head_impl)->buffers)._M_h +
                       ((uVar11 & 0xffffffff) %
                       *(size_type *)((long)&(_Var1._M_head_impl)->buffers + 8)) * 8);
    for (plVar10 = (long *)*plVar5; (uVar11 & 0xffffffff) != plVar10[1]; plVar10 = (long *)*plVar10)
    {
      plVar5 = plVar10;
    }
    pFVar6 = unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
             ::operator->((unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
                           *)(*plVar5 + 0x10));
    pdVar7 = FixedSizeBuffer::Get(pFVar6,true);
    lVar14 = (ulong)(uVar13 & 0xffffff) * (_Var1._M_head_impl)->segment_size;
    bVar9 = *byte;
    if ((*(ulong *)(pdVar7 + (ulong)(bVar9 >> 6) * 8 +
                             (_Var1._M_head_impl)->bitmask_offset + lVar14 + 8) >>
         ((ulong)bVar9 & 0x3f) & 1) != 0) {
      bVar15 = true;
      goto LAB_0170cb75;
    }
    uVar11 = (ulong)bVar9;
    do {
      uVar12 = uVar11;
      if (uVar12 == 0xff) {
        return uVar12 < 0xff;
      }
      uVar11 = uVar12 + 1;
    } while ((*(ulong *)(pdVar7 + (uVar11 >> 6) * 8 +
                                  (_Var1._M_head_impl)->bitmask_offset + lVar14 + 8) >>
              (uVar11 & 0x3f) & 1) == 0);
    bVar15 = uVar12 < 0xff;
  }
  else {
    NVar3 = NVar3 & 0x7f;
    if (NVar3 == NODE_15_LEAF) {
      paVar4 = shared_ptr<std::array<duckdb::unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_false>,_9UL>,_true>
               ::operator*(&art->allocators);
      _Var1._M_head_impl =
           paVar4->_M_elems[7].
           super_unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
           ._M_t.
           super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
           .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>._M_head_impl;
      plVar5 = *(long **)(*(long *)&((_Var1._M_head_impl)->buffers)._M_h +
                         ((uVar11 & 0xffffffff) %
                         *(size_type *)((long)&(_Var1._M_head_impl)->buffers + 8)) * 8);
      for (plVar10 = (long *)*plVar5; (uVar11 & 0xffffffff) != plVar10[1];
          plVar10 = (long *)*plVar10) {
        plVar5 = plVar10;
      }
      pFVar6 = unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
               ::operator->((unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
                             *)(*plVar5 + 0x10));
      pdVar7 = FixedSizeBuffer::Get(pFVar6,false);
      lVar14 = (ulong)(uVar13 & 0xffffff) * (_Var1._M_head_impl)->segment_size;
      iVar2 = (_Var1._M_head_impl)->bitmask_offset;
      uVar12 = (ulong)pdVar7[iVar2 + lVar14];
      if (uVar12 == 0) {
        return uVar12 != 0;
      }
      bVar9 = pdVar7[iVar2 + lVar14 + 1];
      bVar15 = true;
      if (*byte <= bVar9) goto LAB_0170cb75;
      uVar8 = 0;
      do {
        if (uVar12 - 1 == uVar8) goto LAB_0170cb79;
        bVar9 = pdVar7[uVar8 + iVar2 + lVar14 + 2];
        uVar8 = uVar8 + 1;
      } while (bVar9 < *byte);
    }
    else {
      if (NVar3 != NODE_7_LEAF) {
        this_00 = (InternalException *)__cxa_allocate_exception(0x10);
        local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_60,"Invalid node type for GetNextByte: %s.","");
        EnumUtil::ToString<duckdb::NType>(&local_40,value);
        InternalException::InternalException<std::__cxx11::string>(this_00,&local_60,&local_40);
        __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
      paVar4 = shared_ptr<std::array<duckdb::unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_false>,_9UL>,_true>
               ::operator*(&art->allocators);
      _Var1._M_head_impl =
           paVar4->_M_elems[6].
           super_unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
           ._M_t.
           super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
           .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>._M_head_impl;
      plVar5 = *(long **)(*(long *)&((_Var1._M_head_impl)->buffers)._M_h +
                         ((uVar11 & 0xffffffff) %
                         *(size_type *)((long)&(_Var1._M_head_impl)->buffers + 8)) * 8);
      for (plVar10 = (long *)*plVar5; (uVar11 & 0xffffffff) != plVar10[1];
          plVar10 = (long *)*plVar10) {
        plVar5 = plVar10;
      }
      pFVar6 = unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
               ::operator->((unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
                             *)(*plVar5 + 0x10));
      pdVar7 = FixedSizeBuffer::Get(pFVar6,false);
      lVar14 = (ulong)(uVar13 & 0xffffff) * (_Var1._M_head_impl)->segment_size;
      iVar2 = (_Var1._M_head_impl)->bitmask_offset;
      uVar12 = (ulong)pdVar7[iVar2 + lVar14];
      if (uVar12 == 0) {
        return uVar12 != 0;
      }
      bVar9 = pdVar7[iVar2 + lVar14 + 1];
      bVar15 = true;
      if (*byte <= bVar9) goto LAB_0170cb75;
      uVar8 = 0;
      do {
        if (uVar12 - 1 == uVar8) {
LAB_0170cb79:
          return uVar8 + 1 < uVar12;
        }
        bVar9 = pdVar7[uVar8 + iVar2 + lVar14 + 2];
        uVar8 = uVar8 + 1;
      } while (bVar9 < *byte);
    }
    uVar11 = (ulong)bVar9;
    bVar15 = uVar8 < uVar12;
  }
  bVar9 = (byte)uVar11;
LAB_0170cb75:
  *byte = bVar9;
  return bVar15;
}

Assistant:

bool Node::GetNextByte(ART &art, uint8_t &byte) const {
	D_ASSERT(HasMetadata());

	auto type = GetType();
	switch (type) {
	case NType::NODE_7_LEAF:
		return Ref<const Node7Leaf>(art, *this, NType::NODE_7_LEAF).GetNextByte(byte);
	case NType::NODE_15_LEAF:
		return Ref<const Node15Leaf>(art, *this, NType::NODE_15_LEAF).GetNextByte(byte);
	case NType::NODE_256_LEAF:
		return Ref<Node256Leaf>(art, *this, NType::NODE_256_LEAF).GetNextByte(byte);
	default:
		throw InternalException("Invalid node type for GetNextByte: %s.", EnumUtil::ToString(type));
	}
}